

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,REF_GRID ref_grid)

{
  size_t __size;
  undefined1 auVar1 [16];
  uint uVar2;
  REF_SUBDIV pRVar3;
  REF_INT *pRVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  
  pRVar3 = (REF_SUBDIV)malloc(0x30);
  *ref_subdiv_ptr = pRVar3;
  if (pRVar3 == (REF_SUBDIV)0x0) {
    pcVar7 = "malloc *ref_subdiv_ptr of REF_SUBDIV_STRUCT NULL";
    uVar6 = 0x86;
  }
  else {
    pRVar3->grid = ref_grid;
    uVar2 = ref_edge_create(&pRVar3->edge,ref_grid);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x8e
             ,"ref_subdiv_create",(ulong)uVar2,"create edge");
      return uVar2;
    }
    uVar2 = pRVar3->edge->n;
    if ((long)(int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x91
             ,"ref_subdiv_create","malloc ref_subdiv->mark of REF_INT negative");
      return 1;
    }
    __size = (long)(int)uVar2 * 4;
    pRVar4 = (REF_INT *)malloc(__size);
    pRVar3->mark = pRVar4;
    auVar1 = _DAT_0020d110;
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar7 = "malloc ref_subdiv->mark of REF_INT NULL";
      uVar6 = 0x91;
    }
    else {
      if (uVar2 == 0) {
        pRVar4 = (REF_INT *)malloc(__size);
        pRVar3->node = pRVar4;
        if (pRVar4 != (REF_INT *)0x0) goto LAB_001c6999;
      }
      else {
        lVar5 = (ulong)uVar2 - 1;
        auVar15._8_4_ = (int)lVar5;
        auVar15._0_8_ = lVar5;
        auVar15._12_4_ = (int)((ulong)lVar5 >> 0x20);
        lVar5 = 0;
        auVar15 = auVar15 ^ _DAT_0020d110;
        auVar12 = _DAT_0020d0f0;
        auVar9 = _DAT_0020d100;
        do {
          auVar11 = auVar9 ^ auVar1;
          iVar14 = auVar15._0_4_;
          iVar16 = auVar15._4_4_;
          iVar17 = auVar15._12_4_;
          if ((bool)(~(auVar11._4_4_ == iVar16 && iVar14 < auVar11._0_4_ || iVar16 < auVar11._4_4_)
                    & 1)) {
            *(undefined4 *)((long)pRVar4 + lVar5) = 0;
          }
          if ((auVar11._12_4_ != iVar17 || auVar11._8_4_ <= auVar15._8_4_) &&
              auVar11._12_4_ <= iVar17) {
            *(undefined4 *)((long)pRVar4 + lVar5 + 4) = 0;
          }
          auVar11 = auVar12 ^ auVar1;
          iVar13 = auVar11._4_4_;
          if (iVar13 <= iVar16 && (iVar13 != iVar16 || auVar11._0_4_ <= iVar14)) {
            *(undefined4 *)((long)pRVar4 + lVar5 + 8) = 0;
            *(undefined4 *)((long)pRVar4 + lVar5 + 0xc) = 0;
          }
          lVar8 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 4;
          auVar9._8_8_ = lVar8 + 4;
          lVar8 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 4;
          auVar12._8_8_ = lVar8 + 4;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar5);
        pRVar4 = (REF_INT *)malloc(__size);
        auVar1 = _DAT_0020d110;
        pRVar3->node = pRVar4;
        if (pRVar4 != (REF_INT *)0x0) {
          if (uVar2 != 0) {
            lVar5 = 0;
            auVar11 = _DAT_0020d0f0;
            auVar10 = _DAT_0020d100;
            do {
              auVar12 = auVar10 ^ auVar1;
              if ((bool)(~(auVar12._4_4_ == iVar16 && iVar14 < auVar12._0_4_ ||
                          iVar16 < auVar12._4_4_) & 1)) {
                *(undefined4 *)((long)pRVar4 + lVar5) = 0xffffffff;
              }
              if ((auVar12._12_4_ != iVar17 || auVar12._8_4_ <= auVar15._8_4_) &&
                  auVar12._12_4_ <= iVar17) {
                *(undefined4 *)((long)pRVar4 + lVar5 + 4) = 0xffffffff;
              }
              auVar12 = auVar11 ^ auVar1;
              iVar13 = auVar12._4_4_;
              if (iVar13 <= iVar16 && (iVar13 != iVar16 || auVar12._0_4_ <= iVar14)) {
                *(undefined4 *)((long)pRVar4 + lVar5 + 8) = 0xffffffff;
                *(undefined4 *)((long)pRVar4 + lVar5 + 0xc) = 0xffffffff;
              }
              lVar8 = auVar10._8_8_;
              auVar10._0_8_ = auVar10._0_8_ + 4;
              auVar10._8_8_ = lVar8 + 4;
              lVar8 = auVar11._8_8_;
              auVar11._0_8_ = auVar11._0_8_ + 4;
              auVar11._8_8_ = lVar8 + 4;
              lVar5 = lVar5 + 0x10;
            } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar5);
          }
LAB_001c6999:
          pRVar3->allow_geometry = 1;
          pRVar3->new_mark_allowed = 1;
          pRVar3->instrument = 0;
          pRVar3->debug = 0;
          return 0;
        }
      }
      pcVar7 = "malloc ref_subdiv->node of REF_INT NULL";
      uVar6 = 0x93;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar6,
         "ref_subdiv_create",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,
                                     REF_GRID ref_grid) {
  REF_SUBDIV ref_subdiv;

  ref_malloc(*ref_subdiv_ptr, 1, REF_SUBDIV_STRUCT);

  ref_subdiv = *ref_subdiv_ptr;

  ref_subdiv_grid(ref_subdiv) = ref_grid;

  RSS(ref_edge_create(&(ref_subdiv_edge(ref_subdiv)),
                      ref_subdiv_grid(ref_subdiv)),
      "create edge");

  ref_malloc_init(ref_subdiv->mark, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, 0);
  ref_malloc_init(ref_subdiv->node, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, REF_EMPTY);

  ref_subdiv->allow_geometry = REF_TRUE;
  ref_subdiv->new_mark_allowed = REF_TRUE;

  ref_subdiv->instrument = REF_FALSE;
  ref_subdiv->debug = REF_FALSE;

  return REF_SUCCESS;
}